

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::AssignmentExpression::fromSyntax
          (Compilation *compilation,BinaryExpressionSyntax *syntax,ASTContext *context)

{
  SyntaxKind kind;
  ExpressionSyntax *pEVar1;
  Scope *lhs_00;
  bool bVar2;
  BinaryOperator BVar3;
  int iVar4;
  Expression *pEVar5;
  ulong uVar6;
  undefined4 extraout_var;
  Expression *rhs;
  ulong uVar7;
  bitmask<slang::ast::ASTFlags> extraFlags;
  SyntaxNode *syntax_00;
  DiagCode code;
  bitmask<slang::ast::AssignFlags> flags;
  SourceRange SVar8;
  SourceRange SVar9;
  Expression *lhs;
  TimingControl *local_d8;
  Scope *local_68;
  char acStack_60 [8];
  ulong local_58;
  Symbol *pSStack_50;
  TempVarSymbol *local_48;
  RandomizeDetails *pRStack_40;
  AssertionInstanceDetails *local_38;
  
  kind = (syntax->super_ExpressionSyntax).super_SyntaxNode.kind;
  if (kind == NonblockingAssignmentExpression) {
    flags.m_bits = '\x01';
    if (((context->flags).m_bits & 0x1000) != 0) {
      SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      code.subsystem = Expressions;
      code.code = 0xcb;
      goto LAB_00417077;
    }
  }
  else {
    flags.m_bits = '\0';
  }
  uVar7 = (context->flags).m_bits;
  if ((uVar7 & 8) != 0) {
    extraFlags.m_bits = 0x80;
    uVar7 = 0;
    if (kind == AssignmentExpression) {
      uVar6 = 0;
    }
    else {
      uVar6 = 0;
      if (kind != NonblockingAssignmentExpression) {
        BVar3 = OpInfo::getBinary(kind);
        uVar7 = (ulong)BVar3;
        uVar6 = 0x100000000;
        extraFlags.m_bits = 0;
      }
    }
    syntax_00 = &((syntax->right).ptr)->super_SyntaxNode;
    if ((((context->flags).m_bits & 0x100) == 0) ||
       ((((ExpressionSyntax *)syntax_00)->super_SyntaxNode).kind != TimingControlExpression)) {
      local_d8 = (TimingControl *)0x0;
    }
    else {
      local_68 = (context->scope).ptr;
      acStack_60 = *(char (*) [8])&context->lookupIndex;
      pSStack_50 = context->instanceOrProc;
      local_48 = context->firstTempVar;
      pRStack_40 = context->randomizeDetails;
      local_38 = context->assertionInstance;
      local_58 = (ulong)(kind == NonblockingAssignmentExpression) << 0xd | (context->flags).m_bits |
                 0x100000;
      iVar4 = TimingControl::bind((int)*(undefined8 *)
                                        &((ExpressionSyntax *)syntax_00)[1].super_SyntaxNode,
                                  (sockaddr *)&local_68,(socklen_t)extraFlags.m_bits);
      local_d8 = (TimingControl *)CONCAT44(extraout_var,iVar4);
      syntax_00 = ((ExpressionSyntax *)syntax_00)[1].super_SyntaxNode.parent;
    }
    pEVar1 = (syntax->left).ptr;
    if ((((pEVar1->super_SyntaxNode).kind == AssignmentPatternExpression) &&
        (((SyntaxNode *)&syntax_00->kind)->kind != StreamingConcatenationExpression)) &&
       (*(long *)&pEVar1[1].super_SyntaxNode == 0)) {
      pEVar5 = Expression::selfDetermined
                         (compilation,(ExpressionSyntax *)syntax_00,context,
                          (bitmask<slang::ast::ASTFlags>)0x0);
      local_68 = (Scope *)Expression::create(compilation,(syntax->left).ptr,context,
                                             (bitmask<slang::ast::ASTFlags>)0x100000,
                                             (pEVar5->type).ptr);
      Expression::selfDetermined(context,(Expression **)&local_68);
      lhs_00 = local_68;
      SVar8 = parsing::Token::range(&syntax->operatorToken);
      SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pEVar5 = fromComponents(compilation,(optional<slang::ast::BinaryOperator>)(uVar6 | uVar7),
                              flags,(Expression *)lhs_00,pEVar5,SVar8,local_d8,SVar9,context);
    }
    else {
      pEVar5 = Expression::selfDetermined
                         (compilation,(syntax->left).ptr,context,
                          (bitmask<slang::ast::ASTFlags>)(extraFlags.m_bits + 0x100000));
      bVar2 = Type::isVirtualInterfaceOrArray((pEVar5->type).ptr);
      if (bVar2) {
        rhs = Expression::tryBindInterfaceRef(context,(ExpressionSyntax *)syntax_00,false);
      }
      else {
        rhs = (Expression *)0x0;
      }
      if (rhs == (Expression *)0x0) {
        if ((pEVar5->kind == Streaming) &&
           (((SyntaxNode *)&syntax_00->kind)->kind != StreamingConcatenationExpression)) {
          rhs = Expression::selfDetermined
                          (compilation,(ExpressionSyntax *)syntax_00,context,extraFlags);
        }
        else {
          rhs = Expression::create(compilation,(ExpressionSyntax *)syntax_00,context,extraFlags,
                                   (pEVar5->type).ptr);
        }
      }
      SVar8 = parsing::Token::range(&syntax->operatorToken);
      SVar9 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
      pEVar5 = fromComponents(compilation,(optional<slang::ast::BinaryOperator>)(uVar6 | uVar7),
                              flags,pEVar5,rhs,SVar8,local_d8,SVar9,context);
    }
    return pEVar5;
  }
  SVar8 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  code.subsystem = Expressions;
  code.code = 0xb;
  if ((uVar7 & 0x30) == 0) {
    code.subsystem = Expressions;
    code.code = 0x17;
  }
LAB_00417077:
  ASTContext::addDiag(context,code,SVar8);
  pEVar5 = Expression::badExpr(compilation,(Expression *)0x0);
  return pEVar5;
}

Assistant:

Expression& AssignmentExpression::fromSyntax(Compilation& compilation,
                                             const BinaryExpressionSyntax& syntax,
                                             const ASTContext& context) {
    bitmask<AssignFlags> assignFlags;
    bool isNonBlocking = syntax.kind == SyntaxKind::NonblockingAssignmentExpression;
    if (isNonBlocking)
        assignFlags = AssignFlags::NonBlocking;

    if (isNonBlocking && context.flags.has(ASTFlags::Final)) {
        context.addDiag(diag::NonblockingInFinal, syntax.sourceRange());
        return badExpr(compilation, nullptr);
    }

    if (!context.flags.has(ASTFlags::AssignmentAllowed)) {
        if (!context.flags.has(ASTFlags::NonProcedural) &&
            !context.flags.has(ASTFlags::AssignmentDisallowed)) {
            context.addDiag(diag::AssignmentRequiresParens, syntax.sourceRange());
        }
        else {
            context.addDiag(diag::AssignmentNotAllowed, syntax.sourceRange());
        }
        return badExpr(compilation, nullptr);
    }

    bitmask<ASTFlags> extraFlags = ASTFlags::None;
    std::optional<BinaryOperator> op;
    if (syntax.kind != SyntaxKind::AssignmentExpression &&
        syntax.kind != SyntaxKind::NonblockingAssignmentExpression) {
        op = OpInfo::getBinary(syntax.kind);
    }
    else {
        extraFlags |= ASTFlags::StreamingAllowed;
    }

    const ExpressionSyntax* rightExpr = syntax.right;

    // If we're in a top-level statement, check for an intra-assignment timing control.
    // Otherwise, we'll let this fall through to the default handler which will issue an error.
    const TimingControl* timingControl = nullptr;
    if (context.flags.has(ASTFlags::TopLevelStatement) &&
        rightExpr->kind == SyntaxKind::TimingControlExpression) {

        ASTContext timingCtx = context;
        timingCtx.flags |= ASTFlags::LValue;
        if (isNonBlocking)
            timingCtx.flags |= ASTFlags::NonBlockingTimingControl;

        auto& tce = rightExpr->as<TimingControlExpressionSyntax>();
        timingControl = &TimingControl::bind(*tce.timing, timingCtx);
        rightExpr = tce.expr;
    }

    // The right hand side of an assignment expression is typically an
    // "assignment-like context", except if the left hand side does not
    // have a self-determined type. That can only be true if the lhs is
    // an assignment pattern without an explicit type.
    // However, streaming concatenation has no explicit type either so it is excluded and such right
    // hand side will lead to diag::AssignmentPatternNoContext error later.
    if (syntax.left->kind == SyntaxKind::AssignmentPatternExpression &&
        rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
        auto& pattern = syntax.left->as<AssignmentPatternExpressionSyntax>();
        if (!pattern.type) {
            // In this case we have to bind the rhs first to determine the
            // correct type to use as the context for the lhs.
            auto rhs = &selfDetermined(compilation, *rightExpr, context);
            auto lhs = &create(compilation, *syntax.left, context, ASTFlags::LValue, rhs->type);
            selfDetermined(context, lhs);

            return fromComponents(compilation, op, assignFlags, *lhs, *rhs,
                                  syntax.operatorToken.range(), timingControl, syntax.sourceRange(),
                                  context);
        }
    }

    auto& lhs = selfDetermined(compilation, *syntax.left, context, extraFlags | ASTFlags::LValue);

    Expression* rhs = nullptr;
    if (lhs.type->isVirtualInterfaceOrArray())
        rhs = tryBindInterfaceRef(context, *rightExpr, /* isInterfacePort */ false);

    if (!rhs) {
        // When LHS is a streaming concatenation which has no explicit type, RHS should be
        // self-determined and we cannot pass lsh.type to it. When both LHS and RHS are streaming
        // concatenations, pass lhs.type to notify RHS to exclude associative arrays for
        // isBitstreamType check, while RHS can still be self-determined by ignoring lhs type
        // information.
        if (lhs.kind == ExpressionKind::Streaming &&
            rightExpr->kind != SyntaxKind::StreamingConcatenationExpression) {
            rhs = &selfDetermined(compilation, *rightExpr, context, extraFlags);
        }
        else {
            rhs = &create(compilation, *rightExpr, context, extraFlags, lhs.type);
        }
    }

    return fromComponents(compilation, op, assignFlags, lhs, *rhs, syntax.operatorToken.range(),
                          timingControl, syntax.sourceRange(), context);
}